

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlxContext::createContext(GlxContext *this,GlxContext *shared)

{
  undefined4 uVar3;
  Display *pDVar1;
  GLXFBConfig p_Var2;
  _func_GLXContext_Display_ptr_GLXFBConfig_GLXContext_int_int_ptr *p_Var4;
  int iVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  long lVar8;
  reference pvVar9;
  GLXContext p_Var10;
  bool bVar11;
  bool local_1fa;
  bool local_1f9;
  GLXContext local_1f8;
  undefined1 local_1e0 [8];
  GlxErrorHandler handler;
  value_type_conflict4 local_1c0;
  value_type_conflict4 local_1bc;
  uint local_1b8;
  int local_1b4;
  int debug;
  int profile;
  uint local_1a8 [5];
  value_type_conflict4 local_194;
  undefined1 local_190 [8];
  vector<int,_std::allocator<int>_> attributes_1;
  XVisualInfo *visual;
  int i;
  GLXFBConfig *configs;
  undefined8 *puStack_158;
  int nbConfigs;
  GLXFBConfig *config;
  int local_148;
  int iStack_144;
  bool hasCreateContextArb;
  int minor;
  int major;
  GLXContext toShare;
  undefined1 local_130 [4];
  int nbVisuals;
  XVisualInfo tpl;
  XWindowAttributes windowAttributes;
  GLXFBConfig *fbconfig;
  undefined4 local_58;
  int count;
  int attributes [4];
  long lStack_40;
  uint fbConfigId;
  XVisualInfo *visualInfo;
  ContextSettings settings;
  GlxContext *shared_local;
  GlxContext *this_local;
  
  uVar3 = (this->super_GlContext).m_settings.attributeFlags;
  lStack_40 = 0;
  if (this->m_pbuffer == 0) {
    iVar5 = XGetWindowAttributes(this->m_display,this->m_window,&tpl.colormap_size);
    if (iVar5 == 0) {
      poVar7 = err();
      poVar7 = std::operator<<(poVar7,"Failed to get the window attributes");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      return;
    }
    tpl.visualid._0_4_ = *(undefined4 *)(this->m_display + 0xe0);
    tpl.visual = (Visual *)XVisualIDFromVisual(windowAttributes._16_8_);
    toShare._4_4_ = 0;
    lStack_40 = XGetVisualInfo(this->m_display,3,local_130,(long)&toShare + 4);
  }
  else {
    attributes[3] = 0;
    glXQueryDrawable(this->m_display,this->m_pbuffer,0x8013,attributes + 3);
    local_58 = 0x8013;
    count = attributes[3];
    attributes[0] = 0;
    attributes[1] = 0;
    fbconfig._4_4_ = 0;
    puVar6 = (undefined8 *)
             glXChooseFBConfig(this->m_display,*(undefined4 *)(this->m_display + 0xe0),&local_58,
                               (long)&fbconfig + 4);
    if (fbconfig._4_4_ == 1) {
      lStack_40 = glXGetVisualFromFBConfig(this->m_display,*puVar6);
    }
    if (puVar6 != (undefined8 *)0x0) {
      XFree(puVar6);
    }
  }
  if (lStack_40 == 0) {
    poVar7 = err();
    poVar7 = std::operator<<(poVar7,"Failed to get visual info");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (shared == (GlxContext *)0x0) {
      local_1f8 = (GLXContext)0x0;
    }
    else {
      local_1f8 = shared->m_context;
    }
    _minor = local_1f8;
    iStack_144 = 0;
    local_148 = 0;
    iVar5 = glXQueryVersion(this->m_display,&stack0xfffffffffffffebc,&local_148);
    if (iVar5 == 0) {
      poVar7 = err();
      poVar7 = std::operator<<(poVar7,
                               "Failed to query GLX version, limited to legacy context creation");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    local_1f9 = false;
    if (sfglx_ext_ARB_create_context == 1) {
      local_1fa = 1 < iStack_144 || 2 < local_148;
      local_1f9 = local_1fa;
    }
    config._7_1_ = local_1f9;
    if (local_1f9 == false) {
LAB_0013f22d:
      if (this->m_context == (GLXContext)0x0) {
        (this->super_GlContext).m_settings.majorVersion = 2;
        (this->super_GlContext).m_settings.minorVersion = 1;
        (this->super_GlContext).m_settings.attributeFlags = 0;
        if ((_minor != (GLXContext)0x0) && (iVar5 = glXMakeCurrent(this->m_display,0), iVar5 == 0))
        {
          poVar7 = err();
          poVar7 = std::operator<<(poVar7,"Failed to deactivate shared context before sharing");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          return;
        }
        p_Var10 = (GLXContext)glXCreateContext(this->m_display,lStack_40,_minor,1);
        this->m_context = p_Var10;
      }
      if (this->m_context == (GLXContext)0x0) {
        poVar7 = err();
        poVar7 = std::operator<<(poVar7,"Failed to create an OpenGL context for this window");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      XFree(lStack_40);
    }
    else {
      puStack_158 = (undefined8 *)0x0;
      configs._4_4_ = 0;
      lVar8 = glXChooseFBConfig(this->m_display,*(undefined4 *)(this->m_display + 0xe0),0,
                                (long)&configs + 4);
      for (visual._4_4_ = 0; lVar8 != 0 && visual._4_4_ < configs._4_4_;
          visual._4_4_ = visual._4_4_ + 1) {
        attributes_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)glXGetVisualFromFBConfig
                                (this->m_display,*(undefined8 *)(lVar8 + (long)visual._4_4_ * 8));
        if (attributes_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          if (*(long *)(attributes_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 2) == *(long *)(lStack_40 + 8))
          {
            puStack_158 = (undefined8 *)(lVar8 + (long)visual._4_4_ * 8);
            XFree(attributes_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
            break;
          }
          XFree(attributes_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
        }
      }
      if (puStack_158 == (undefined8 *)0x0) {
        poVar7 = err();
        poVar7 = std::operator<<(poVar7,
                                 "Failed to get GLXFBConfig which corresponds to the window\'s visual"
                                );
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      do {
        bVar11 = false;
        if ((puStack_158 != (undefined8 *)0x0) &&
           (bVar11 = false, this->m_context == (GLXContext)0x0)) {
          bVar11 = (this->super_GlContext).m_settings.majorVersion != 0;
        }
        if (!bVar11) {
          if (lVar8 != 0) {
            XFree(lVar8);
          }
          goto LAB_0013f22d;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_190);
        if ((1 < (this->super_GlContext).m_settings.majorVersion) ||
           (((this->super_GlContext).m_settings.majorVersion == 1 &&
            (1 < (this->super_GlContext).m_settings.minorVersion)))) {
          local_194 = 0x2091;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_190,&local_194);
          local_1a8[0] = (this->super_GlContext).m_settings.majorVersion;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_190,
                     (value_type_conflict4 *)local_1a8);
          profile = 0x2092;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_190,&profile);
          debug = (this->super_GlContext).m_settings.minorVersion;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_190,&debug);
        }
        if (sfglx_ext_ARB_create_context_profile == 1) {
          local_1b4 = 2 - ((this->super_GlContext).m_settings.attributeFlags & 1);
          local_1b8 = ((this->super_GlContext).m_settings.attributeFlags & 4) >> 2;
          local_1bc = 0x9126;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_190,&stack0xfffffffffffffe44);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_190,&local_1b4);
          local_1c0 = 0x2094;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_190,&stack0xfffffffffffffe40);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_190,
                     (value_type_conflict4 *)&stack0xfffffffffffffe48);
        }
        else {
          if ((((this->super_GlContext).m_settings.attributeFlags & 1) != 0) ||
             (((this->super_GlContext).m_settings.attributeFlags & 4) != 0)) {
            poVar7 = err();
            poVar7 = std::operator<<(poVar7,
                                     "Selecting a profile during context creation is not supported,"
                                    );
            poVar7 = std::operator<<(poVar7,"disabling comptibility and debug");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          (this->super_GlContext).m_settings.attributeFlags = 0;
        }
        handler.m_previousHandler._4_4_ = 0;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_190,
                   (value_type_conflict4 *)((long)&handler.m_previousHandler + 4));
        handler.m_previousHandler._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_190,
                   (value_type_conflict4 *)&handler.m_previousHandler);
        anon_unknown.dwarf_6c4e6::GlxErrorHandler::GlxErrorHandler
                  ((GlxErrorHandler *)local_1e0,this->m_display);
        if ((_minor == (GLXContext)0x0) || (iVar5 = glXMakeCurrent(this->m_display,0), iVar5 != 0))
        {
          p_Var10 = _minor;
          p_Var4 = sf_ptrc_glXCreateContextAttribsARB;
          pDVar1 = this->m_display;
          p_Var2 = (GLXFBConfig)*puStack_158;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_190,0);
          p_Var10 = (*p_Var4)(pDVar1,p_Var2,p_Var10,1,pvVar9);
          this->m_context = p_Var10;
          if (this->m_context == (GLXContext)0x0) {
            if ((this->super_GlContext).m_settings.attributeFlags == 0) {
              if ((this->super_GlContext).m_settings.minorVersion == 0) {
                (this->super_GlContext).m_settings.majorVersion =
                     (this->super_GlContext).m_settings.majorVersion - 1;
                (this->super_GlContext).m_settings.minorVersion = 9;
                (this->super_GlContext).m_settings.attributeFlags = uVar3;
              }
              else {
                (this->super_GlContext).m_settings.minorVersion =
                     (this->super_GlContext).m_settings.minorVersion - 1;
                (this->super_GlContext).m_settings.attributeFlags = uVar3;
              }
            }
            else {
              (this->super_GlContext).m_settings.attributeFlags = 0;
            }
          }
          bVar11 = false;
        }
        else {
          poVar7 = err();
          poVar7 = std::operator<<(poVar7,"Failed to deactivate shared context before sharing");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          bVar11 = true;
        }
        anon_unknown.dwarf_6c4e6::GlxErrorHandler::~GlxErrorHandler((GlxErrorHandler *)local_1e0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_190);
      } while (!bVar11);
    }
  }
  return;
}

Assistant:

void GlxContext::createContext(GlxContext* shared)
{
    // Get a working copy of the context settings
    ContextSettings settings = m_settings;

    XVisualInfo* visualInfo = NULL;

    if (m_pbuffer)
    {
        unsigned int fbConfigId = 0;

        glXQueryDrawable(m_display, m_pbuffer, GLX_FBCONFIG_ID, &fbConfigId);

        int attributes[] =
        {
            GLX_FBCONFIG_ID, static_cast<int>(fbConfigId),
            0,               0
        };

        int count = 0;
        GLXFBConfig* fbconfig = glXChooseFBConfig(m_display, DefaultScreen(m_display), attributes, &count);

        if (count == 1)
            visualInfo = glXGetVisualFromFBConfig(m_display, *fbconfig);

        if (fbconfig)
            XFree(fbconfig);
    }
    else
    {
        // Retrieve the attributes of the target window
        XWindowAttributes windowAttributes;
        if (XGetWindowAttributes(m_display, m_window, &windowAttributes) == 0)
        {
            err() << "Failed to get the window attributes" << std::endl;
            return;
        }

        // Get its visuals
        XVisualInfo tpl;
        tpl.screen   = DefaultScreen(m_display);
        tpl.visualid = XVisualIDFromVisual(windowAttributes.visual);
        int nbVisuals = 0;
        visualInfo = XGetVisualInfo(m_display, VisualIDMask | VisualScreenMask, &tpl, &nbVisuals);
    }

    if (!visualInfo)
    {
        err() << "Failed to get visual info" << std::endl;
        return;
    }

    // Get the context to share display lists with
    GLXContext toShare = shared ? shared->m_context : NULL;

    // There are no GLX versions prior to 1.0
    int major = 0;
    int minor = 0;

    if (!glXQueryVersion(m_display, &major, &minor))
        err() << "Failed to query GLX version, limited to legacy context creation" << std::endl;

    // Check if glXCreateContextAttribsARB is available (requires GLX 1.3 or greater)
    bool hasCreateContextArb = (sfglx_ext_ARB_create_context == sfglx_LOAD_SUCCEEDED) && ((major > 1) || (minor >= 3));

    // Create the OpenGL context -- first try using glXCreateContextAttribsARB
    if (hasCreateContextArb)
    {
        // Get a GLXFBConfig that matches the window's visual, for glXCreateContextAttribsARB
        GLXFBConfig* config = NULL;

        // We don't supply attributes to match against, since
        // the visual we are matching against was already
        // deemed suitable in selectBestVisual()
        int nbConfigs = 0;
        GLXFBConfig* configs = glXChooseFBConfig(m_display, DefaultScreen(m_display), NULL, &nbConfigs);

        for (int i = 0; configs && (i < nbConfigs); ++i)
        {
            XVisualInfo* visual = glXGetVisualFromFBConfig(m_display, configs[i]);

            if (!visual)
                continue;

            if (visual->visualid == visualInfo->visualid)
            {
                config = &configs[i];
                XFree(visual);
                break;
            }

            XFree(visual);
        }

        if (!config)
            err() << "Failed to get GLXFBConfig which corresponds to the window's visual" << std::endl;

        while (config && !m_context && m_settings.majorVersion)
        {
            std::vector<int> attributes;

            // Check if the user requested a specific context version (anything > 1.1)
            if ((m_settings.majorVersion > 1) || ((m_settings.majorVersion == 1) && (m_settings.minorVersion > 1)))
            {
                attributes.push_back(GLX_CONTEXT_MAJOR_VERSION_ARB);
                attributes.push_back(m_settings.majorVersion);
                attributes.push_back(GLX_CONTEXT_MINOR_VERSION_ARB);
                attributes.push_back(m_settings.minorVersion);
            }

            // Check if setting the profile is supported
            if (sfglx_ext_ARB_create_context_profile == sfglx_LOAD_SUCCEEDED)
            {
                int profile = (m_settings.attributeFlags & ContextSettings::Core) ? GLX_CONTEXT_CORE_PROFILE_BIT_ARB : GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
                int debug = (m_settings.attributeFlags & ContextSettings::Debug) ? GLX_CONTEXT_DEBUG_BIT_ARB : 0;

                attributes.push_back(GLX_CONTEXT_PROFILE_MASK_ARB);
                attributes.push_back(profile);
                attributes.push_back(GLX_CONTEXT_FLAGS_ARB);
                attributes.push_back(debug);
            }
            else
            {
                if ((m_settings.attributeFlags & ContextSettings::Core) || (m_settings.attributeFlags & ContextSettings::Debug))
                    err() << "Selecting a profile during context creation is not supported,"
                          << "disabling comptibility and debug" << std::endl;

                m_settings.attributeFlags = ContextSettings::Default;
            }

            // Append the terminating 0
            attributes.push_back(0);
            attributes.push_back(0);

            // RAII GLX error handler (we simply ignore errors here)
            // On an error, glXCreateContextAttribsARB will return 0 anyway
            GlxErrorHandler handler(m_display);

            if (toShare)
            {
                if (!glXMakeCurrent(m_display, None, NULL))
                {
                    err() << "Failed to deactivate shared context before sharing" << std::endl;
                    return;
                }
            }

            // Create the context
            m_context = glXCreateContextAttribsARB(m_display, *config, toShare, true, &attributes[0]);

            if (!m_context)
            {
                // If we couldn't create the context, first try disabling flags,
                // then lower the version number and try again -- stop at 0.0
                // Invalid version numbers will be generated by this algorithm (like 3.9), but we really don't care
                if (m_settings.attributeFlags != ContextSettings::Default)
                {
                    m_settings.attributeFlags = ContextSettings::Default;
                }
                else if (m_settings.minorVersion > 0)
                {
                    // If the minor version is not 0, we decrease it and try again
                    m_settings.minorVersion--;

                    m_settings.attributeFlags = settings.attributeFlags;
                }
                else
                {
                    // If the minor version is 0, we decrease the major version
                    m_settings.majorVersion--;
                    m_settings.minorVersion = 9;

                    m_settings.attributeFlags = settings.attributeFlags;
                }
            }
        }

        if (configs)
            XFree(configs);
    }

    // If glXCreateContextAttribsARB failed, use glXCreateContext
    if (!m_context)
    {
        // set the context version to 2.1 (arbitrary) and disable flags
        m_settings.majorVersion = 2;
        m_settings.minorVersion = 1;
        m_settings.attributeFlags = ContextSettings::Default;

#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

        if (toShare)
        {
            if (!glXMakeCurrent(m_display, None, NULL))
            {
                err() << "Failed to deactivate shared context before sharing" << std::endl;
                return;
            }
        }

        // Create the context, using the target window's visual
        m_context = glXCreateContext(m_display, visualInfo, toShare, true);

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::createContext()" << std::endl;
#endif
    }

    if (!m_context)
        err() << "Failed to create an OpenGL context for this window" << std::endl;

    // Free the visual info
    XFree(visualInfo);
}